

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O3

vector<boost::any,_std::allocator<boost::any>_> * __thiscall
Scine::Core::ModuleManager::Impl::getAll
          (vector<boost::any,_std::allocator<boost::any>_> *__return_storage_ptr__,Impl *this,
          string *interface,string *moduleName)

{
  pointer pcVar1;
  element_type *peVar2;
  bool bVar3;
  undefined8 uVar4;
  long *plVar5;
  int iVar6;
  pointer pLVar7;
  undefined8 extraout_RAX;
  uint uVar8;
  pointer pbVar9;
  pointer psVar10;
  bool bVar11;
  string modulePtrLower;
  string moduleNameLower;
  undefined1 local_b8 [16];
  pointer local_a8;
  any local_98;
  undefined1 local_90 [32];
  pointer local_70;
  pointer local_68;
  pointer local_60;
  long *local_58;
  pointer local_50;
  long local_48 [2];
  pointer local_38;
  
  (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::locale::locale((locale *)local_90);
  pcVar1 = (moduleName->_M_dataplus)._M_p;
  local_58 = local_48;
  std::__cxx11::string::
  _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
            ((string *)&local_58,pcVar1,(locale *)local_90,pcVar1 + moduleName->_M_string_length,
             (locale *)local_90);
  std::locale::~locale((locale *)local_90);
  if ((moduleName->_M_string_length == 0) ||
     (iVar6 = std::__cxx11::string::compare((char *)&local_58), iVar6 == 0)) {
    pLVar7 = (this->_sources).
             super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_68 = (this->_sources).
               super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar7 != local_68) {
      do {
        psVar10 = (pLVar7->modules).
                  super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_60 = (pLVar7->modules).
                   super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        local_70 = pLVar7;
        if (psVar10 != local_60) {
          do {
            peVar2 = (psVar10->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            (**(code **)(*(long *)peVar2 + 0x30))(local_90,peVar2,interface);
            uVar4 = local_90._8_8_;
            for (pbVar9 = (pointer)local_90._0_8_; pbVar9 != (pointer)uVar4; pbVar9 = pbVar9 + 1) {
              peVar2 = (psVar10->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              (**(code **)(*(long *)peVar2 + 0x18))(local_b8,peVar2,interface,pbVar9);
              std::vector<boost::any,_std::allocator<boost::any>_>::emplace_back<boost::any>
                        (__return_storage_ptr__,(any *)local_b8);
              if ((placeholder *)local_b8._0_8_ != (placeholder *)0x0) {
                (**(code **)(*(long *)local_b8._0_8_ + 8))();
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_90);
            psVar10 = psVar10 + 1;
          } while (psVar10 != local_60);
        }
        pLVar7 = local_70 + 1;
      } while (pLVar7 != local_68);
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  else {
    pLVar7 = (this->_sources).
             super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (this->_sources).
               super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    uVar8 = 1;
    if (pLVar7 != local_38) {
      local_70 = (pointer)((ulong)local_70 & 0xffffffff00000000);
      do {
        psVar10 = (pLVar7->modules).
                  super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_60 = (pLVar7->modules).
                   super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        local_68 = pLVar7;
        if (psVar10 != local_60) {
          do {
            (**(code **)(*(long *)(psVar10->
                                  super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + 0x10))(local_b8);
            std::locale::locale((locale *)&local_98);
            local_90._0_8_ = (pointer)(local_90 + 0x10);
            std::__cxx11::string::
            _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
                      ((string *)local_90,local_b8._0_8_,(locale *)&local_98,
                       (placeholder *)(local_b8._0_8_ + (long)(_Alloc_hider *)local_b8._8_8_),
                       (locale *)&local_98);
            std::locale::~locale((locale *)&local_98);
            if ((placeholder *)local_b8._0_8_ != (placeholder *)(local_b8 + 0x10)) {
              operator_delete((void *)local_b8._0_8_,
                              (ulong)((long)&(local_a8->_M_dataplus)._M_p + 1));
            }
            pbVar9 = local_50;
            plVar5 = local_58;
            if (((pointer)local_90._8_8_ == local_50) &&
               (((pointer)local_90._8_8_ == (pointer)0x0 ||
                (iVar6 = bcmp((void *)local_90._0_8_,local_58,local_90._8_8_), iVar6 == 0)))) {
LAB_00109df8:
              peVar2 = (psVar10->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              (**(code **)(*(long *)peVar2 + 0x30))(local_b8,peVar2,interface);
              uVar4 = local_b8._8_8_;
              for (pbVar9 = (pointer)local_b8._0_8_; pbVar9 != (pointer)uVar4; pbVar9 = pbVar9 + 1)
              {
                peVar2 = (psVar10->
                         super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                ;
                (**(code **)(*(long *)peVar2 + 0x18))(&local_98,peVar2,interface,pbVar9);
                std::vector<boost::any,_std::allocator<boost::any>_>::emplace_back<boost::any>
                          (__return_storage_ptr__,&local_98);
                if (local_98.content != (placeholder *)0x0) {
                  (**(code **)(*(long *)local_98.content + 8))();
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_b8);
              local_70 = (pointer)CONCAT44(local_70._4_4_,
                                           (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
              bVar3 = false;
            }
            else {
              local_b8._0_8_ = local_b8 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_b8,plVar5,(long)&(pbVar9->_M_dataplus)._M_p + (long)plVar5)
              ;
              std::__cxx11::string::append(local_b8);
              uVar4 = local_b8._0_8_;
              if (local_90._8_8_ == local_b8._8_8_) {
                if ((pointer)local_90._8_8_ == (pointer)0x0) {
                  bVar11 = false;
                }
                else {
                  iVar6 = bcmp((void *)local_90._0_8_,(void *)local_b8._0_8_,local_90._8_8_);
                  bVar11 = iVar6 != 0;
                }
              }
              else {
                bVar11 = true;
              }
              if ((placeholder *)uVar4 != (placeholder *)(local_b8 + 0x10)) {
                operator_delete((void *)uVar4,(ulong)((long)&(local_a8->_M_dataplus)._M_p + 1));
              }
              bVar3 = true;
              if (!bVar11) goto LAB_00109df8;
            }
            if ((pointer)local_90._0_8_ != (pointer)(local_90 + 0x10)) {
              operator_delete((void *)local_90._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_90._16_8_)->_M_p + 1));
            }
            if (!bVar3) {
              uVar8 = (uint)local_70;
              goto LAB_00109f8e;
            }
            psVar10 = psVar10 + 1;
          } while (psVar10 != local_60);
        }
        pLVar7 = local_68 + 1;
      } while (pLVar7 != local_38);
      uVar8 = 1;
    }
LAB_00109f8e:
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    if ((uVar8 & 1) == 0) {
      std::vector<boost::any,_std::allocator<boost::any>_>::~vector(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<boost::any> getAll(const std::string& interface, const std::string& moduleName) const {
    std::vector<boost::any> models;

    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          for (const auto& model : modulePtr->announceModels(interface)) {
            models.push_back(modulePtr->get(interface, model));
          }

          return models;
        }
      }
      return models;
    }

    for (const auto& source : _sources) {
      for (const auto& modulePtr : source.modules) {
        for (const auto& model : modulePtr->announceModels(interface)) {
          models.push_back(modulePtr->get(interface, model));
        }
      }
    }

    return models;
  }